

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int drive_compressor(archive_write_filter *f,private_data_conflict6 *data,int finishing)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int ret;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  archive *a;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  while( true ) {
    if (*(long *)(in_RSI + 0x28) == 0) {
      *(long *)(in_RSI + 0x138) = *(long *)(in_RSI + 0x130) + *(long *)(in_RSI + 0x138);
      iVar1 = __archive_write_filter
                        ((archive_write_filter *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (iVar1 != 0) {
        return -0x1e;
      }
      *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x128);
      *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(in_RSI + 0x130);
    }
    if ((in_EDX == 0) && (*(long *)(in_RSI + 0x10) == 0)) {
      return 0;
    }
    uVar2 = lzma_code(in_RSI + 8,(in_EDX != 0) * '\x03');
    if (uVar2 != 0) break;
    if ((in_EDX == 0) && (*(long *)(in_RSI + 0x10) == 0)) {
      return 0;
    }
    in_stack_ffffffffffffffdc = 0;
  }
  if (uVar2 == 1) {
    if (in_EDX != 0) {
      return 0;
    }
    archive_set_error(*(archive **)(in_RDI + 8),-1,"lzma compression data error");
    return -0x1e;
  }
  if (uVar2 != 6) {
    archive_set_error(*(archive **)(in_RDI + 8),-1,
                      "lzma compression failed: lzma_code() call returned status %d",(ulong)uVar2);
    return -0x1e;
  }
  a = *(archive **)(in_RDI + 8);
  lVar3 = lzma_memusage(in_RSI + 8);
  archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                    lVar3 + 0xfffffU >> 0x14);
  return -0x1e;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out =
			    (uInt)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = deflate(&(data->stream),
		    finishing ? Z_FINISH : Z_NO_FLUSH );

		switch (ret) {
		case Z_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case Z_STREAM_END:
			/* This return can only occur in finishing case. */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "GZip compression failed:"
			    " deflate() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}